

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  GetterXsYs<float> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterXsYRef<float> *pGVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  uint uVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  float fVar37;
  
  pIVar18 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  lVar21 = (long)(((pGVar8->Offset + prim + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride;
  fVar22 = *(float *)((long)pGVar8->Ys + lVar21);
  dVar14 = log10((double)*(float *)((long)pGVar8->Xs + lVar21) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar18->CurrentPlot;
  dVar1 = pIVar18->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar15 = log10((double)fVar22 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar19 = GImPlot;
  iVar5 = pTVar9->YAxis;
  pIVar10 = pIVar18->CurrentPlot;
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar6 = pGVar11->Count;
  auVar33._8_8_ = dVar15;
  auVar33._0_8_ = dVar14;
  dVar14 = pGVar11->YRef;
  auVar16._8_4_ = SUB84(pIVar18->LogDenY[iVar5],0);
  auVar16._0_8_ = dVar1;
  auVar16._12_4_ = (int)((ulong)pIVar18->LogDenY[iVar5] >> 0x20);
  auVar34 = divpd(auVar33,auVar16);
  dVar1 = pIVar10->YAxis[iVar5].Range.Min;
  IVar4 = pIVar18->PixelRange[iVar5].Min;
  fVar22 = (float)(pIVar18->Mx *
                   (((double)(float)auVar34._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar24 = (float)(pIVar18->My[iVar5] *
                   (((double)(float)auVar34._8_8_ * (pIVar10->YAxis[iVar5].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  dVar15 = log10((double)*(float *)((long)pGVar11->Xs +
                                   (long)(((prim + 1 + pGVar11->Offset) % iVar6 + iVar6) % iVar6) *
                                   (long)pGVar11->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  pIVar10 = pIVar19->CurrentPlot;
  dVar1 = pIVar19->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar14 = log10(dVar14 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar5 = pTVar9->YAxis;
  auVar27._8_8_ = dVar14;
  auVar27._0_8_ = dVar15;
  auVar34._8_4_ = SUB84(pIVar19->LogDenY[iVar5],0);
  auVar34._0_8_ = dVar1;
  auVar34._12_4_ = (int)((ulong)pIVar19->LogDenY[iVar5] >> 0x20);
  auVar34 = divpd(auVar27,auVar34);
  pIVar10 = pIVar19->CurrentPlot;
  dVar1 = pIVar10->YAxis[iVar5].Range.Min;
  IVar4 = pIVar19->PixelRange[iVar5].Min;
  fVar23 = (float)(pIVar19->Mx *
                   (((double)(float)auVar34._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar25 = (float)(pIVar19->My[iVar5] *
                   (((double)(float)auVar34._8_8_ * (pIVar10->YAxis[iVar5].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar29 = (this->P12).x;
  fVar30 = (this->P12).y;
  fVar32 = (this->P11).x;
  fVar35 = (this->P11).y;
  fVar26 = fVar24 * fVar32 - fVar22 * fVar35;
  fVar36 = fVar29 * fVar25 - fVar30 * fVar23;
  fVar32 = fVar32 - fVar22;
  fVar29 = fVar29 - fVar23;
  fVar31 = fVar30 - fVar25;
  fVar37 = fVar31 * fVar32 - (fVar35 - fVar24) * fVar29;
  auVar28._0_4_ = fVar26 * fVar29 - fVar36 * fVar32;
  auVar28._4_4_ = fVar26 * fVar31 - fVar36 * (fVar35 - fVar24);
  auVar28._8_4_ = fVar24 * 0.0 - fVar30 * 0.0;
  auVar28._12_4_ = fVar24 * 0.0 - fVar30 * 0.0;
  auVar17._4_4_ = fVar37;
  auVar17._0_4_ = fVar37;
  auVar17._8_4_ = fVar31;
  auVar17._12_4_ = fVar31;
  auVar34 = divps(auVar28,auVar17);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12->col = this->Col;
  pIVar12[1].pos.x = fVar22;
  pIVar12[1].pos.y = fVar24;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[1].col = this->Col;
  pIVar12[2].pos = auVar34._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[2].col = this->Col;
  pIVar12[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[3].col = this->Col;
  IVar4.y = fVar25;
  IVar4.x = fVar23;
  pIVar12[4].pos = IVar4;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar12 + 5;
  uVar7 = DrawList->_VtxCurrentIdx;
  puVar13 = DrawList->_IdxWritePtr;
  *puVar13 = uVar7;
  uVar20 = -(uint)(fVar30 < fVar35 && fVar24 < fVar25 || fVar25 < fVar24 && fVar35 < fVar30) & 1;
  puVar13[1] = uVar7 + uVar20 + 1;
  puVar13[2] = DrawList->_VtxCurrentIdx + 3;
  puVar13[3] = DrawList->_VtxCurrentIdx + 1;
  puVar13[4] = (uVar20 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar13[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar13 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar22;
  (this->P11).y = fVar24;
  (this->P12).x = fVar23;
  (this->P12).y = fVar25;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }